

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O3

genxAttribute_conflict
declareAttribute(genxWriter w,genxNamespace ns,constUtf8 name,constUtf8 valuestr,genxStatus *statusP
                )

{
  collector *c;
  void **ppvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  genxStatus gVar5;
  genxAttribute_conflict pgVar6;
  undefined4 extraout_var;
  size_t sVar7;
  genxAttribute_conflict pgVar8;
  int iVar9;
  
  ppvVar1 = (w->attributes).pointers;
  (w->arec).ns = ns;
  (w->arec).name = name;
  if (ns == (genxNamespace)0x0) {
    iVar2 = strncmp((char *)name,"xmlns",5);
    (w->arec).atype = (uint)(iVar2 != 0);
LAB_001d50d9:
    iVar2 = (w->attributes).count;
    if (0 < iVar2) {
      iVar4 = -1;
      do {
        iVar9 = (iVar2 + iVar4) / 2;
        iVar3 = orderAttributes(&w->arec,(genxAttribute_conflict)ppvVar1[iVar9]);
        if (-1 < iVar3) {
          iVar4 = iVar9;
          iVar9 = iVar2;
        }
        iVar2 = iVar9;
      } while (1 < iVar2 - iVar4);
      if (iVar4 != -1) {
        pgVar6 = (genxAttribute_conflict)ppvVar1[iVar4];
        iVar4 = orderAttributes(&w->arec,pgVar6);
        if (iVar4 == 0) {
          return pgVar6;
        }
      }
    }
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      pgVar6 = (genxAttribute_conflict)malloc(0x30);
    }
    else {
      pgVar6 = (genxAttribute_conflict)(*w->alloc)(w->userData,0x30);
    }
    if (pgVar6 != (genxAttribute_conflict)0x0) {
      pgVar6->writer = w;
      pgVar6->ns = ns;
      pgVar6->provided = 0;
      pgVar6->atype = (w->arec).atype;
      iVar4 = copy((EVP_PKEY_CTX *)w,(EVP_PKEY_CTX *)name);
      pgVar6->name = (utf8)CONCAT44(extraout_var,iVar4);
      if ((utf8)CONCAT44(extraout_var,iVar4) != (utf8)0x0) {
        c = &pgVar6->value;
        gVar5 = initCollector(w,c);
        w->status = gVar5;
        if (gVar5 == GENX_SUCCESS) {
          if (valuestr != (constUtf8)0x0) {
            sVar7 = strlen((char *)valuestr);
            if ((pgVar6->value).space <= (int)sVar7) {
              gVar5 = growCollector(w,c,(int)sVar7);
              w->status = gVar5;
              if (gVar5 != GENX_SUCCESS) goto LAB_001d5210;
            }
            strcpy((char *)c->buf,(char *)valuestr);
            w->status = GENX_SUCCESS;
          }
          gVar5 = listInsert(&w->attributes,pgVar6,iVar2);
          w->status = gVar5;
          pgVar8 = (genxAttribute_conflict)0x0;
          if (gVar5 == GENX_SUCCESS) {
            pgVar8 = pgVar6;
          }
          goto LAB_001d521f;
        }
        goto LAB_001d521d;
      }
    }
LAB_001d5210:
    w->status = GENX_ALLOC_FAILED;
    gVar5 = GENX_ALLOC_FAILED;
  }
  else {
    (w->arec).atype = ATTR_PREFIXED;
    if (ns->defaultDecl != w->xmlnsEquals) goto LAB_001d50d9;
    w->status = GENX_ATTRIBUTE_IN_DEFAULT_NAMESPACE;
    gVar5 = GENX_ATTRIBUTE_IN_DEFAULT_NAMESPACE;
  }
LAB_001d521d:
  pgVar8 = (genxAttribute_conflict)0x0;
LAB_001d521f:
  *statusP = gVar5;
  return pgVar8;
}

Assistant:

static genxAttribute declareAttribute(genxWriter w, genxNamespace ns,
				      constUtf8 name, constUtf8 valuestr,
				      genxStatus * statusP)
{
  int high, low;
  genxAttribute * aa = (genxAttribute *) w->attributes.pointers;
  genxAttribute a;

  w->arec.ns = ns;
  w->arec.name = (utf8) name;

  if (ns)
    w->arec.atype = ATTR_PREFIXED;
  else if (strncmp((const char *) name, "xmlns", STRLEN_XMLNS_COLON - 1) == 0)
    w->arec.atype = ATTR_NSDECL;
  else
    w->arec.atype = ATTR_NAKED;

  if (ns && (ns->defaultDecl == w->xmlnsEquals))
  {
    w->status = GENX_ATTRIBUTE_IN_DEFAULT_NAMESPACE;
    goto busted;
  }

  /* attribute list has to be kept sorted per c14n rules */
  high = w->attributes.count; low = -1;
  while (high - low > 1)
  {
    int probe = (high + low) / 2;
    if (orderAttributes(&w->arec, aa[probe]) < 0)
      high = probe;
    else
      low = probe;
  }

  /* if it was already there */
  if (low != -1 && orderAttributes(&w->arec, aa[low]) == 0)
    return aa[low];

  /* not there, build it */
  a = (genxAttribute) allocate(w, sizeof(struct genxAttribute_rec));
  if (a == NULL)
  {
    w->status = GENX_ALLOC_FAILED;
    goto busted;
  }

  a->writer = w;
  a->ns = ns;
  a->provided = False;
  a->atype = w->arec.atype;

  if ((a->name = copy(w, name)) == NULL)
  {
    w->status = GENX_ALLOC_FAILED;
    goto busted;
  }

  if ((w->status = initCollector(w, &a->value)) != GENX_SUCCESS)
    goto busted;

  if (valuestr)
    if ((w->status = collectString(w, &a->value, valuestr)) != GENX_SUCCESS)
      goto busted;
  
  w->status = listInsert(&w->attributes, a, high);
  if (w->status != GENX_SUCCESS)
    goto busted;
  
  *statusP = GENX_SUCCESS;
  return a;

busted:
  *statusP = w->status;
  return NULL;
}